

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O1

bool instMatchesCrit(Instruction *I,string *fun,uint line,string *obj,LLVMPointerAnalysis *pta)

{
  char cVar1;
  char cVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  raw_ostream *prVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar12;
  StringRef Str;
  StringRef Str_00;
  string objname;
  string local_98;
  LLVMPointerAnalysis *local_78;
  long *local_70 [2];
  long local_60 [2];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  sVar3 = fun->_M_string_length;
  local_78 = pta;
  if (sVar3 == 0) {
LAB_001272ea:
    bVar10 = false;
  }
  else {
    auVar11 = llvm::Value::getName();
    lVar7 = auVar11._0_8_;
    local_50 = &local_40;
    if (lVar7 == 0) {
      local_48 = 0;
      local_40 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,lVar7,auVar11._8_8_ + lVar7);
    }
    bVar10 = true;
    if (local_48 == fun->_M_string_length) {
      if (local_48 == 0) goto LAB_001272ea;
      iVar5 = bcmp(local_50,(fun->_M_dataplus)._M_p,local_48);
      bVar10 = iVar5 != 0;
    }
  }
  if ((sVar3 != 0) && (local_50 != &local_40)) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if ((bVar10) ||
     ((line != 0 &&
      ((*(long *)(I + 0x30) == 0 || (uVar6 = llvm::DebugLoc::getLine(), uVar6 != line)))))) {
    return false;
  }
  if (obj->_M_string_length == 0) {
    return true;
  }
  cVar1 = *(obj->_M_dataplus)._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  if (cVar1 == '&') {
    std::__cxx11::string::substr((ulong)local_70,(ulong)obj);
    std::__cxx11::string::operator=((string *)&local_98,(string *)local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_98);
  }
  cVar2 = *local_98._M_dataplus._M_p;
  if (cVar2 == '@') {
    std::__cxx11::string::substr((ulong)local_70,(ulong)obj);
    std::__cxx11::string::operator=((string *)&local_98,(string *)local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  if (local_98._M_string_length < 3) {
    bVar10 = false;
  }
  else {
    iVar5 = std::__cxx11::string::compare
                      ((ulong)&local_98,local_98._M_string_length - 2,(char *)0x2);
    bVar10 = iVar5 == 0;
  }
  if (bVar10) {
    std::__cxx11::string::substr((ulong)local_70,(ulong)&local_98);
    std::__cxx11::string::operator=((string *)&local_98,(string *)local_70);
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
  }
  if (bVar10 && cVar1 == '&') {
    if (instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
        ::reported_abi_cxx11_ == '\0') {
      instMatchesCrit();
    }
    pVar12 = std::
             _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             ::_M_insert_unique<std::__cxx11::string_const&>
                       ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&instMatchesCrit(llvm::Instruction_const&,std::__cxx11::string_const&,unsigned_int,std::__cxx11::string_const&,dg::LLVMPointerAnalysis*)
                            ::reported_abi_cxx11_,obj);
    if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      prVar8 = (raw_ostream *)llvm::errs();
      Str.Length = 0x42;
      Str.Data = "ERROR: ignoring invalid criterion (var and func at the same time: ";
      prVar8 = llvm::raw_ostream::operator<<(prVar8,Str);
      prVar8 = (raw_ostream *)
               llvm::raw_ostream::write((char *)prVar8,(ulong)(obj->_M_dataplus)._M_p);
      Str_00.Length = 1;
      Str_00.Data = "\n";
      llvm::raw_ostream::operator<<(prVar8,Str_00);
    }
  }
  else {
    if (cVar1 != '&') {
      bVar4 = instIsCallOf(I,&local_98,local_78);
      bVar9 = true;
      if (bVar4) goto LAB_00127558;
    }
    if (!bVar10) {
      bVar10 = usesTheVariable(I,&local_98,cVar2 == '@',local_78);
      bVar9 = true;
      if (bVar10) goto LAB_00127558;
    }
  }
  bVar9 = false;
LAB_00127558:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return bVar9;
}

Assistant:

static bool instMatchesCrit(const llvm::Instruction &I, const std::string &fun,
                            unsigned line, const std::string &obj,
                            LLVMPointerAnalysis *pta = nullptr) {
    // function match?
    if (!fun.empty() && I.getParent()->getParent()->getName().str() != fun)
        return false;

    // line match?
    if (line > 0) {
        const auto &Loc = I.getDebugLoc();
#if (LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR < 7)
        if (Loc.getLine() != line)
#else
        if (!Loc || line != Loc.getLine())
#endif
        {
            return false;
        }
    }

    if (obj.empty()) {
        // we passed the line check and we have no obj to check
        return true;
    }

    // TODO: allow speficy namespaces, not only global/non-global
    bool isvar = obj[0] == '&';
    std::string objname;
    if (isvar) {
        objname = obj.substr(1);
    } else {
        objname = obj;
    }

    bool isglobal = objname[0] == '@';
    if (isglobal) {
        objname = obj.substr(1);
    }

    auto len = objname.length();
    bool isfunc = len > 2 && objname.compare(len - 2, 2, "()") == 0;
    if (isfunc) {
        objname = objname.substr(0, len - 2);
    }

    if (isvar && isfunc) {
        static std::set<std::string> reported;
        if (reported.insert(obj).second) {
            llvm::errs() << "ERROR: ignoring invalid criterion (var and func "
                            "at the same time: "
                         << obj << "\n";
        }
        return false;
    }

    // obj match?
    if (!isvar && instIsCallOf(I, objname, pta)) {
        return true;
    } // else fall through to check the vars

    if (!isfunc && usesTheVariable(I, objname, isglobal, pta)) {
        return true;
    }

    return false;
}